

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void create_netconfig(TadsNetConfig **c,char **argv)

{
  TadsNetConfig *this;
  FILE *pFVar1;
  char *__nbytes;
  long *in_RDI;
  CVmMainClientIfcStdio ifc;
  osfildef *fp;
  char confpath [4096];
  char confname [4096];
  char *in_stack_ffffffffffffdfb8;
  undefined1 *__buf;
  size_t in_stack_ffffffffffffdfc8;
  char *in_stack_ffffffffffffdfd0;
  int in_stack_ffffffffffffe05c;
  char *in_stack_ffffffffffffe060;
  size_t in_stack_ffffffffffffe068;
  char *in_stack_ffffffffffffe070;
  char local_1028 [4128];
  long *local_8;
  
  if (*in_RDI == 0) {
    local_8 = in_RDI;
    this = (TadsNetConfig *)operator_new(0x10);
    TadsNetConfig::TadsNetConfig(this);
    *local_8 = (long)this;
    os_get_special_path(in_stack_ffffffffffffe070,in_stack_ffffffffffffe068,
                        in_stack_ffffffffffffe060,in_stack_ffffffffffffe05c);
    __nbytes = "tadsweb.config";
    os_build_full_path(in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8,(char *)this,
                       in_stack_ffffffffffffdfb8);
    pFVar1 = fopen(local_1028,"rb");
    if (pFVar1 == (FILE *)0x0) {
      fprintf(_stderr,
              "Warning: -webhost mode specified, but couldn\'t read web config file \"%s\"\n",
              local_1028);
    }
    else {
      __buf = &stack0xffffffffffffdfc8;
      CVmMainClientIfcStdio::CVmMainClientIfcStdio((CVmMainClientIfcStdio *)this);
      TadsNetConfig::read((TadsNetConfig *)*local_8,(int)pFVar1,__buf,(size_t)__nbytes);
      CVmMainClientIfcStdio::~CVmMainClientIfcStdio((CVmMainClientIfcStdio *)0x21e896);
    }
  }
  return;
}

Assistant:

static void
create_netconfig( TadsNetConfig*& c, const char* const* argv)
{
    // If we don't have a network config object yet, create it.
    if (c == 0) {
        // Create a new config object.
        // We don't manage this; the VM will call delete on it.
        c = new TadsNetConfig();
        
        // Get the path to the network config file.
        char confname[OSFNMAX], confpath[OSFNMAX];
        os_get_special_path(confpath, sizeof(confpath), argv[0],
                            OS_GSP_T3_SYSCONFIG);
        os_build_full_path(confname, sizeof(confname),
                           confpath, "tadsweb.config");
        
        // If the config file exists, load it.
        osfildef* fp = osfoprb(confname, OSFTTEXT);
        if (fp != 0) {
            // Read the file.
            CVmMainClientIfcStdio ifc;
            c->read(fp, &ifc);
        } else {
            // Warn that the file is missing.
            fprintf(stderr, "Warning: -webhost mode specified, but couldn't "
                    "read web config file \"%s\"\n", confname);
        }
    }
}